

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O1

Am_Value * __thiscall
Formula_Context::Get
          (Formula_Context *this,Am_Object_Advanced *object,Am_Slot_Key key,Am_Slot_Flags flags)

{
  Am_Slot_Data *pAVar1;
  Formula_Constraint *context;
  bool bVar2;
  Am_Slot_Key AVar3;
  int iVar4;
  undefined4 extraout_var;
  Dependency *pDVar5;
  Am_Constraint_Tag pvVar6;
  Am_Value *pAVar7;
  Dependency **ppDVar8;
  Am_Slot slot;
  Am_Slot local_38;
  Am_Object local_30;
  
  if ((flags & 4) != 0) {
    iVar4 = (*Am_Empty_Constraint_Context->_vptr_Am_Constraint_Context[1])
                      (Am_Empty_Constraint_Context,object,(ulong)key);
    return (Am_Value *)CONCAT44(extraout_var,iVar4);
  }
  local_38.data = (Am_Slot_Data *)0x0;
  if (this->current_position == (Dependency *)0x0) {
LAB_001c741e:
    local_38 = Am_Object_Advanced::Get_Slot(object,key);
    pDVar5 = this->current_position;
    if (pDVar5 == (Dependency *)0x0) {
      pDVar5 = (Dependency *)Dyn_Memory_Manager::New(&Dependency::memory);
      (pDVar5->depended).data = (Am_Slot_Data *)0x0;
      pDVar5->dependency_tag = (Am_Constraint_Tag)0x0;
      pDVar5->next = (Dependency *)0x0;
      (pDVar5->depended).data = local_38.data;
      pvVar6 = Am_Slot::Add_Dependency(&local_38,(Am_Constraint *)this->context);
      pDVar5->dependency_tag = pvVar6;
      pDVar5->next = (Dependency *)0x0;
      ppDVar8 = &this->last_position->next;
      if (this->last_position == (Dependency *)0x0) {
        ppDVar8 = &this->context->depends_on;
      }
      *ppDVar8 = pDVar5;
      this->last_position = pDVar5;
      goto LAB_001c74b4;
    }
    context = this->context;
    context->internal_remove = true;
    Dependency::Move_Back_Dep(pDVar5,&local_38,(Am_Constraint *)context);
    this->context->internal_remove = false;
  }
  else {
    pAVar1 = (this->current_position->depended).data;
    local_38.data = pAVar1;
    if (pAVar1 == (Am_Slot_Data *)0x0) {
LAB_001c7407:
      bVar2 = false;
    }
    else {
      Am_Slot::Get_Owner((Am_Slot *)&local_30);
      bVar2 = Am_Object::operator==(&local_30,&object->super_Am_Object);
      if (!bVar2) goto LAB_001c7407;
      AVar3 = Am_Slot::Get_Key(&local_38);
      bVar2 = AVar3 == key;
    }
    if (pAVar1 != (Am_Slot_Data *)0x0) {
      Am_Object::~Am_Object(&local_30);
    }
    if (!bVar2) goto LAB_001c741e;
  }
  this->last_position = this->current_position;
  this->current_position = this->current_position->next;
LAB_001c74b4:
  Am_Slot::Validate(&local_38);
  pAVar7 = Am_Slot::Get(&local_38);
  return pAVar7;
}

Assistant:

const Am_Value &
Formula_Context::Get(const Am_Object_Advanced &object, Am_Slot_Key key,
                     Am_Slot_Flags flags)
{
  if (flags & Am_NO_DEPENDENCY)
    return Am_Empty_Constraint_Context->Get(object, key, flags);

  Am_Slot slot;

  if (current_position) {
    slot = current_position->depended;
    if (slot && (slot.Get_Owner() == object) && (slot.Get_Key() == key)) {
      last_position = current_position;
      current_position = current_position->next;
      slot.Validate();
      return slot.Get();
    }
  }
  slot = object.Get_Slot(key);
  if (current_position) {
    context->internal_remove = true;
    current_position->Move_Back_Dep(slot, context);
    context->internal_remove = false;
    last_position = current_position;
    current_position = current_position->next;
  } else {
    Dependency *new_dep = new Dependency();

    new_dep->depended = slot;
    new_dep->dependency_tag = slot.Add_Dependency(context);
    new_dep->next = nullptr;
    if (last_position)
      last_position->next = new_dep;
    else
      context->depends_on = new_dep;
    last_position = new_dep;
  }

  slot.Validate();
  return slot.Get();
}